

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O0

QDataStream * operator>>(QDataStream *in,QByteArray *ba)

{
  qint64 qVar1;
  longlong *plVar2;
  QDataStream *pQVar3;
  QDataStream *in_RDI;
  long in_FS_OFFSET;
  qsizetype blockSize;
  qsizetype allocated;
  qsizetype len;
  qint64 size;
  qsizetype Step;
  QByteArray *in_stack_ffffffffffffff88;
  QDataStream *in_stack_ffffffffffffff90;
  QDataStream *this;
  QByteArray *this_00;
  long local_30;
  longlong local_28 [4];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QByteArray::clear((QByteArray *)0x4b742a);
  qVar1 = QDataStream::readQSizeType(in_stack_ffffffffffffff90);
  if (qVar1 < -1) {
    QByteArray::clear((QByteArray *)0x4b7461);
    QDataStream::setStatus(in_RDI,SizeLimitExceeded);
  }
  else if (qVar1 == -1) {
    QByteArray::QByteArray((QByteArray *)0x4b7491);
    QByteArray::operator=((QByteArray *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    QByteArray::~QByteArray((QByteArray *)0x4b74aa);
  }
  else {
    local_28[0] = 0x100000;
    this_00 = (QByteArray *)0x0;
    do {
      local_30 = qVar1 - (long)this_00;
      plVar2 = qMin<long_long>(local_28,&local_30);
      this = (QDataStream *)*plVar2;
      QByteArray::resize(this_00,(qsizetype)this);
      pQVar3 = in_RDI;
      QByteArray::data((QByteArray *)in_RDI);
      pQVar3 = (QDataStream *)
               QDataStream::readRawData(this,(char *)pQVar3,(qint64)in_stack_ffffffffffffff88);
      if (pQVar3 != this) {
        QByteArray::clear((QByteArray *)0x4b7541);
        QDataStream::setStatus(in_RDI,ReadPastEnd);
        break;
      }
      this_00 = (QByteArray *)((long)&(this_00->d).d + (long)&this->d);
    } while ((long)this_00 < qVar1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QDataStream &operator>>(QDataStream &in, QByteArray &ba)
{
    ba.clear();

    qint64 size = QDataStream::readQSizeType(in);
    qsizetype len = size;
    if (size != len || size < -1) {
        ba.clear();
        in.setStatus(QDataStream::SizeLimitExceeded);
        return in;
    }
    if (len == -1) { // null byte-array
        ba = QByteArray();
        return in;
    }

    constexpr qsizetype Step = 1024 * 1024;
    qsizetype allocated = 0;

    do {
        qsizetype blockSize = qMin(Step, len - allocated);
        ba.resize(allocated + blockSize);
        if (in.readRawData(ba.data() + allocated, blockSize) != blockSize) {
            ba.clear();
            in.setStatus(QDataStream::ReadPastEnd);
            return in;
        }
        allocated += blockSize;
    } while (allocated < len);

    return in;
}